

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O1

int __thiscall UnifiedRegex::OctoquadIdentifier::GetOrAddCharCode(OctoquadIdentifier *this,Char c)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = -1;
  if ((ushort)(c + L'﾿') < 0x1a) {
    iVar1 = this->numCodes;
    lVar6 = (long)iVar1;
    bVar2 = 0 < lVar6;
    if (0 < lVar6) {
      lVar5 = 0;
      if ((*this->codeToChar)[0] != c) {
        lVar5 = 0;
        do {
          if (iVar1 + -1 == (int)lVar5) goto LAB_00e7747b;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while ((*this->codeToChar)[lVar3] != c);
        bVar2 = (int)lVar5 < iVar1;
      }
      if (bVar2) {
        return (int)lVar5;
      }
    }
LAB_00e7747b:
    iVar4 = -1;
    if (iVar1 != 4) {
      (*this->codeToChar)[lVar6] = (char)c;
      (*this->charToCode)[(ushort)c] = (char)this->numCodes;
      iVar4 = this->numCodes;
      this->numCodes = iVar4 + 1;
    }
  }
  return iVar4;
}

Assistant:

int OctoquadIdentifier::GetOrAddCharCode(const Char c)
    {
        if (c >= static_cast<Char>('A') && c <= static_cast<Char>('Z'))
        {
            for (int i = 0; i < numCodes; i++)
            {
                if (codeToChar[i] == static_cast<char>(c))
                    return i;
            }
            if (numCodes == TrigramAlphabet::AlphaCount)
                return -1;
            codeToChar[numCodes] = static_cast<char>(c);
            charToCode[c] = static_cast<char>(numCodes);
            return numCodes++;
        }
        else
            return -1;
    }